

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterInvocationTestCase::
genBarrierSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long lVar1;
  char *pcVar2;
  ostringstream buf;
  undefined1 auStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_188);
  if (*(char *)((long)this + 0x7e) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_188,"\tgroupMemoryBarrier();\n",0x17);
    lVar1 = 0xc;
    pcVar2 = "\tbarrier();\n";
LAB_014ea806:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,pcVar2,lVar1);
  }
  else if (*(int *)((long)this + 0x78) != 0) {
    if (*(int *)((long)this + 0x78) != 1) goto LAB_014ea822;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\n",1);
    lVar1 = 0x17;
    pcVar2 = "\tmemoryBarrierImage();\n";
    goto LAB_014ea806;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\n",1);
LAB_014ea822:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_188);
  std::ios_base::~ios_base((ios_base *)(auStack_188 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string InterInvocationTestCase::genBarrierSource (void) const
{
	std::ostringstream buf;

	if (m_syncWithGroup)
	{
		// Wait until all invocations in this work group have their texture/buffer read/write operations complete
		// \note We could also use memoryBarrierBuffer() or memoryBarrierImage() in place of groupMemoryBarrier() but
		//       we only require intra-workgroup synchronization.
		buf << "\n"
			<< "	groupMemoryBarrier();\n"
			<< "	barrier();\n"
			<< "\n";
	}
	else if (m_storage == STORAGE_BUFFER)
	{
		DE_ASSERT(!m_syncWithGroup);

		// Waiting only for data written by this invocation. Since all buffer reads and writes are
		// processed in order (within a single invocation), we don't have to do anything.
		buf << "\n";
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		DE_ASSERT(!m_syncWithGroup);

		// Waiting only for data written by this invocation. But since operations complete in undefined
		// order, we have to wait for them to complete.
		buf << "\n"
			<< "	memoryBarrierImage();\n"
			<< "\n";
	}
	else
		DE_ASSERT(DE_FALSE);

	return buf.str();
}